

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int luaopen_sharedata_core(lua_State *L)

{
  luaL_Reg l [15];
  luaL_Reg alStack_108 [15];
  
  memcpy(alStack_108,&PTR_anon_var_dwarf_21e83_00162d10,0xf0);
  luaL_checkversion_(L,503.0,0x88);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xe);
  luaL_setfuncs(L,alStack_108,0);
  return 1;
}

Assistant:

int
luaopen_sharedata_core(lua_State *L) {
	luaL_Reg l[] = {
		// used by host
		{ "new", lnewconf },
		{ "delete", ldeleteconf },
		{ "markdirty", lmarkdirty },
		{ "getref", lgetref },
		{ "incref", lincref },
		{ "decref", ldecref },

		// used by client
		{ "box", lboxconf },
		{ "index", lindexconf },
		{ "nextkey", lnextkey },
		{ "len", llen },
		{ "hashlen", lhashlen },
		{ "isdirty", lisdirty },
		{ "needupdate", lneedupdate },
		{ "update", lupdate },
		{ NULL, NULL },
	};
	luaL_checkversion(L);
	luaL_newlib(L, l);

	return 1;
}